

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapPerm.c
# Opt level: O0

uint * Amap_LibVerifyPerm_rec
                 (Amap_Lib_t *pLib,Amap_Nod_t *pNod,Vec_Ptr_t *vTtElems,Vec_Int_t *vTruth,int nWords
                 ,int *piInput)

{
  int iVar1;
  Amap_Nod_t *pAVar2;
  uint *puVar3;
  uint *puVar4;
  int local_6c;
  int i;
  uint *pTruth;
  uint *pTruth1;
  uint *pTruth0;
  Amap_Nod_t *pFan1;
  Amap_Nod_t *pFan0;
  int *piInput_local;
  int nWords_local;
  Vec_Int_t *vTruth_local;
  Vec_Ptr_t *vTtElems_local;
  Amap_Nod_t *pNod_local;
  Amap_Lib_t *pLib_local;
  
  if (*(uint *)pNod >> 0x18 != 6) {
    if (((undefined1  [24])*pNod & (undefined1  [24])0xffff) == (undefined1  [24])0x0) {
      iVar1 = *piInput;
      *piInput = iVar1 + 1;
      pLib_local = (Amap_Lib_t *)Vec_PtrEntry(vTtElems,iVar1);
    }
    else {
      iVar1 = Abc_Lit2Var((int)pNod->iFan0);
      pAVar2 = Amap_LibNod(pLib,iVar1);
      puVar3 = Amap_LibVerifyPerm_rec(pLib,pAVar2,vTtElems,vTruth,nWords,piInput);
      iVar1 = Abc_Lit2Var((int)pNod->iFan1);
      pAVar2 = Amap_LibNod(pLib,iVar1);
      puVar4 = Amap_LibVerifyPerm_rec(pLib,pAVar2,vTtElems,vTruth,nWords,piInput);
      pLib_local = (Amap_Lib_t *)Vec_IntFetch(vTruth,nWords);
      if (*(uint *)pNod >> 0x18 == 5) {
        for (local_6c = 0; local_6c < nWords; local_6c = local_6c + 1) {
          *(uint *)((long)&pLib_local->pName + (long)local_6c * 4) =
               puVar3[local_6c] ^ puVar4[local_6c];
        }
      }
      else {
        iVar1 = Abc_LitIsCompl((int)pNod->iFan0);
        if ((iVar1 == 0) && (iVar1 = Abc_LitIsCompl((int)pNod->iFan1), iVar1 == 0)) {
          for (local_6c = 0; local_6c < nWords; local_6c = local_6c + 1) {
            *(uint *)((long)&pLib_local->pName + (long)local_6c * 4) =
                 puVar3[local_6c] & puVar4[local_6c];
          }
        }
        else {
          iVar1 = Abc_LitIsCompl((int)pNod->iFan0);
          if ((iVar1 == 0) && (iVar1 = Abc_LitIsCompl((int)pNod->iFan1), iVar1 != 0)) {
            for (local_6c = 0; local_6c < nWords; local_6c = local_6c + 1) {
              *(uint *)((long)&pLib_local->pName + (long)local_6c * 4) =
                   puVar3[local_6c] & (puVar4[local_6c] ^ 0xffffffff);
            }
          }
          else {
            iVar1 = Abc_LitIsCompl((int)pNod->iFan0);
            if ((iVar1 == 0) || (iVar1 = Abc_LitIsCompl((int)pNod->iFan1), iVar1 != 0)) {
              for (local_6c = 0; local_6c < nWords; local_6c = local_6c + 1) {
                *(uint *)((long)&pLib_local->pName + (long)local_6c * 4) =
                     (puVar3[local_6c] ^ 0xffffffff) & (puVar4[local_6c] ^ 0xffffffff);
              }
            }
            else {
              for (local_6c = 0; local_6c < nWords; local_6c = local_6c + 1) {
                *(uint *)((long)&pLib_local->pName + (long)local_6c * 4) =
                     (puVar3[local_6c] ^ 0xffffffff) & puVar4[local_6c];
              }
            }
          }
        }
      }
    }
    return (uint *)pLib_local;
  }
  __assert_fail("pNod->Type != AMAP_OBJ_MUX",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/amap/amapPerm.c"
                ,0xf3,
                "unsigned int *Amap_LibVerifyPerm_rec(Amap_Lib_t *, Amap_Nod_t *, Vec_Ptr_t *, Vec_Int_t *, int, int *)"
               );
}

Assistant:

unsigned * Amap_LibVerifyPerm_rec( Amap_Lib_t * pLib, Amap_Nod_t * pNod, 
    Vec_Ptr_t * vTtElems, Vec_Int_t * vTruth, int nWords, int * piInput )
{
    Amap_Nod_t * pFan0, * pFan1;
    unsigned * pTruth0, * pTruth1, * pTruth;
    int i;
    assert( pNod->Type != AMAP_OBJ_MUX );
    if ( pNod->Id == 0 )
        return (unsigned *)Vec_PtrEntry( vTtElems, (*piInput)++ );
    pFan0 = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan0) );
    pTruth0 = Amap_LibVerifyPerm_rec( pLib, pFan0, vTtElems, vTruth, nWords, piInput );
    pFan1 = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan1) );
    pTruth1 = Amap_LibVerifyPerm_rec( pLib, pFan1, vTtElems, vTruth, nWords, piInput );
    pTruth  = Vec_IntFetch( vTruth, nWords );
    if ( pNod->Type == AMAP_OBJ_XOR )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] ^ pTruth1[i];
    else if ( !Abc_LitIsCompl(pNod->iFan0) && !Abc_LitIsCompl(pNod->iFan1) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & pTruth1[i];
    else if ( !Abc_LitIsCompl(pNod->iFan0) && Abc_LitIsCompl(pNod->iFan1) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & ~pTruth1[i];
    else if ( Abc_LitIsCompl(pNod->iFan0) && !Abc_LitIsCompl(pNod->iFan1) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & pTruth1[i];
    else // if ( Abc_LitIsCompl(pNod->iFan0) && Hop_ObjFaninC1(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & ~pTruth1[i];
    return pTruth;
}